

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

void slang::
     function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
     ::
     callback_fn<slang::ast::checkFormatString(slang::ast::ASTContext_const&,slang::ast::StringLiteral_const&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>&,__gnu_cxx::__normal_iterator<slang::ast::Expression_const*const*,std::span<slang::ast::Expression_const*const,18446744073709551615ul>>)::__1>
               (intptr_t callable,char params,unsigned_long params_1,unsigned_long params_2,
               FormatOptions *params_3)

{
  undefined8 *puVar1;
  Expression *this;
  ASTContext *this_00;
  Type *this_01;
  byte bVar2;
  bool bVar3;
  char cVar4;
  bitwidth_t bVar5;
  Diagnostic *pDVar6;
  SourceLocation SVar7;
  SourceLocation SVar8;
  SourceRange sourceRange;
  SourceRange range;
  SourceRange range_00;
  
  bVar2 = charToLower(params);
  if ((bVar2 & 0xfe) == 0x6c) {
    return;
  }
  SVar8 = (SourceLocation)(params_1 * 0x10000000 + *(long *)**(undefined8 **)callable);
  SVar7 = (SourceLocation)(params_2 * 0x10000000 + (long)SVar8);
  puVar1 = (undefined8 *)**(long **)(callable + 8);
  if (puVar1 == (undefined8 *)**(long **)(callable + 0x10)) {
    sourceRange.endLoc = SVar7;
    sourceRange.startLoc = SVar8;
    pDVar6 = ast::ASTContext::addDiag
                       (*(ASTContext **)(callable + 0x18),(DiagCode)0x12000b,sourceRange);
    Diagnostic::operator<<(pDVar6,params);
LAB_0029c94e:
    **(undefined1 **)(callable + 0x20) = 0;
    return;
  }
  **(long **)(callable + 8) = (long)(puVar1 + 1);
  this = (Expression *)*puVar1;
  this_00 = *(ASTContext **)(callable + 0x18);
  if (this->kind == EmptyArgument) {
    pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x10000b,this->sourceRange);
    pDVar6 = Diagnostic::operator<<(pDVar6,params);
    range.endLoc = SVar7;
    range.startLoc = SVar8;
    Diagnostic::operator<<(pDVar6,range);
    goto LAB_0029c94e;
  }
  bVar3 = ast::Expression::bad(this);
  if (bVar3) {
    bVar2 = 0;
    goto LAB_0029ca64;
  }
  this_01 = (this->type).ptr;
  cVar4 = charToLower(params);
  switch(cVar4) {
  case 'b':
  case 'c':
  case 'd':
  case 'h':
  case 'o':
  case 'x':
    bVar3 = ast::Type::isIntegral(this_01);
    bVar2 = 1;
    if ((bVar3) || (bVar3 = ast::Type::isString(this_01), bVar3)) goto LAB_0029ca64;
    bVar3 = ast::Type::isFloating(this_01);
    if (bVar3) {
      pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x2d000b,this->sourceRange);
      pDVar6 = Diagnostic::operator<<(pDVar6,params);
      goto LAB_0029caaf;
    }
    break;
  case 'e':
  case 'f':
  case 'g':
  case 't':
    bVar3 = ast::Type::isNumeric(this_01);
    goto LAB_0029ca1f;
  case 'p':
    bVar3 = ast::Type::isVoid(this_01);
    bVar2 = 1;
    if (!bVar3) goto LAB_0029ca64;
    break;
  case 's':
    bVar3 = ast::Type::canBeStringLike(this_01);
    goto LAB_0029ca1f;
  case 'u':
  case 'z':
    bVar3 = ast::isValidForRaw(this_01);
LAB_0029ca1f:
    bVar2 = 1;
    if (bVar3 != false) goto LAB_0029ca64;
    break;
  case 'v':
    bVar3 = ast::Type::isIntegral(this_01);
    if (!bVar3) break;
    bVar5 = ast::Type::getBitWidth(this_01);
    bVar2 = 1;
    if (bVar5 < 2) goto LAB_0029ca64;
    pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x2c000b,this->sourceRange);
LAB_0029caaf:
    bVar2 = 1;
    goto LAB_0029ca56;
  }
  pDVar6 = ast::ASTContext::addDiag(this_00,(DiagCode)0x11000b,this->sourceRange);
  pDVar6 = ast::operator<<(pDVar6,this_01);
  pDVar6 = Diagnostic::operator<<(pDVar6,params);
  bVar2 = 0;
LAB_0029ca56:
  range_00.endLoc = SVar7;
  range_00.startLoc = SVar8;
  Diagnostic::operator<<(pDVar6,range_00);
LAB_0029ca64:
  **(byte **)(callable + 0x20) = **(byte **)(callable + 0x20) & bVar2;
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }